

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dtoa.cc
# Opt level: O2

void TestDtoaSign(void)

{
  undefined1 uVar1;
  undefined1 condition;
  bool sign;
  int point;
  int length;
  char buffer_container [100];
  
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,SHORTEST,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x159,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-0.0,SHORTEST,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x15c,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (1.0,SHORTEST,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x15f,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-1.0,SHORTEST,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x162,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,SHORTEST_SINGLE,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x165,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-0.0,SHORTEST_SINGLE,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x168,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (1.0,SHORTEST_SINGLE,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x16b,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-1.0,SHORTEST_SINGLE,0,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x16e,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  uVar1 = 100;
  condition = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,PRECISION,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x171,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = condition;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-0.0,PRECISION,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x174,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (1.0,PRECISION,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x177,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-1.0,PRECISION,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x17a,0xc19cd9,(char *)(ulong)sign,(bool)condition);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,FIXED,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x17d,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-0.0,FIXED,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x180,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (1.0,FIXED,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x183,0xc19cd8,(char *)(ulong)(sign ^ 1),(bool)uVar1);
  uVar1 = 100;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (-1.0,FIXED,1,buffer_container,100,&sign,&length,&point);
  CheckHelper((char *)0x186,0xc19cd9,(char *)(ulong)sign,(bool)uVar1);
  return;
}

Assistant:

TEST(DtoaSign) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool sign;
  int length;
  int point;

  DoubleToAscii(0.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(sign);
}